

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_matrix.cpp
# Opt level: O3

double __thiscall ON_SubDMatrix::TestMatrix(ON_SubDMatrix *this)

{
  double *E2;
  double *LP;
  double *L1;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double *pdVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  double *pdVar11;
  size_t E1_capacity;
  ulong uVar12;
  double *L2;
  undefined4 uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  ON_SimpleArray<double> buffer;
  undefined8 local_118;
  double local_e8;
  undefined1 local_b8 [16];
  double local_88;
  undefined1 local_78 [16];
  double dStack_60;
  double local_58;
  double dStack_50;
  ON_SimpleArray<double> local_48;
  
  if ((((((this->m_S == (double **)0x0) || (this->m_R < 3)) ||
        (bVar4 = ON_SubDSectorType::IsValid(&this->m_sector_type), !bVar4)) ||
       ((uVar8 = this->m_R, uVar7 = ON_SubDSectorType::PointRingCount(&this->m_sector_type),
        uVar8 != uVar7 ||
        (local_e8 = ON_SubDSectorType::SubdominantEigenvalue(&this->m_sector_type), local_e8 <= 0.0)
        ))) || (1.0 <= local_e8)) ||
     (uVar8 = ON_SubDSectorType::SubdominantEigenvalueMulitiplicity(&this->m_sector_type),
     uVar8 == 0)) {
    ON_SubDIncrementErrorCount();
    local_118._0_4_ = 0x9e331dd2;
    local_118._4_4_ = 0xffe5f8bd;
    goto LAB_00621e2c;
  }
  bVar4 = ON_SubDSectorType::IsValid(&this->m_sector_type);
  local_48._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080a228;
  local_48.m_a = (double *)0x0;
  local_48.m_count = 0;
  local_48.m_capacity = 0;
  if (this->m_R == 0) {
    E1_capacity = 0;
  }
  else {
    ON_SimpleArray<double>::SetCapacity(&local_48,(ulong)(this->m_R * 5));
    E1_capacity = (size_t)this->m_R;
  }
  pdVar3 = local_48.m_a;
  E2 = local_48.m_a + E1_capacity;
  dVar20 = ON_SubDSectorType::GetSubdominantEigenvectors
                     (&this->m_sector_type,local_48.m_a,E1_capacity,E2,E1_capacity);
  if ((dVar20 != local_e8) || (NAN(dVar20) || NAN(local_e8))) {
LAB_00621ea4:
    ON_SubDIncrementErrorCount();
LAB_006224d5:
    local_118 = -1.23432101234321e+308;
  }
  else {
    LP = E2 + E1_capacity;
    L1 = LP + E1_capacity;
    L2 = L1 + E1_capacity;
    uVar9 = (ulong)this->m_R;
    if (bVar4) {
      uVar7 = ON_SubDSectorType::GetSurfaceEvaluationCoefficients
                        (&this->m_sector_type,LP,uVar9,L1,uVar9,L2,uVar9);
      if (uVar7 == 0) goto LAB_00621ea4;
    }
    else if (uVar9 != 0) {
      uVar12 = 0;
      do {
        LP[uVar12] = 0.0;
        L1[uVar12] = 0.0;
        L2[uVar12] = 0.0;
        uVar12 = uVar12 + 1;
      } while (uVar9 != uVar12);
    }
    bVar5 = ON_SubDSectorType::IsSmoothSector(&this->m_sector_type);
    if (((bVar5) || (bVar5 = ON_SubDSectorType::IsDartSector(&this->m_sector_type), bVar5)) &&
       (uVar7 = ON_SubDSectorType::FaceCount(&this->m_sector_type), uVar7 == 2)) {
      uVar7 = ON_SubDSectorType::EdgeCount(&this->m_sector_type);
      bVar5 = uVar7 == 2;
    }
    else {
      bVar5 = false;
    }
    bVar6 = ON_SubDSectorType::IsSmoothSector(&this->m_sector_type);
    if (((bVar6) || (bVar6 = ON_SubDSectorType::IsDartSector(&this->m_sector_type), bVar6)) &&
       (uVar7 = ON_SubDSectorType::FaceCount(&this->m_sector_type), uVar7 == 2)) {
      uVar7 = ON_SubDSectorType::EdgeCount(&this->m_sector_type);
      bVar6 = uVar7 == 2;
    }
    else {
      bVar6 = false;
    }
    uVar9 = (ulong)this->m_R;
    if (uVar9 == 0) {
LAB_006224d0:
      ON_SubDIncrementErrorCount();
      goto LAB_006224d5;
    }
    bVar5 = (bool)(bVar5 | bVar6);
    dVar16 = 0.0;
    dVar18 = 0.0;
    dVar19 = 0.0;
    dVar20 = 0.0;
    pdVar11 = pdVar3;
    do {
      dVar19 = dVar19 + pdVar11[E1_capacity] * pdVar11[E1_capacity];
      dVar20 = dVar20 + *pdVar11 * *pdVar11;
      dVar16 = dVar16 + pdVar11[E1_capacity * 4] * pdVar11[E1_capacity * 4];
      dVar18 = dVar18 + pdVar11[E1_capacity * 3] * pdVar11[E1_capacity * 3];
      pdVar11 = pdVar11 + 1;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
    if (((!(bool)(0.0 < dVar20 | bVar5)) || (dVar19 <= 0.0)) || ((dVar18 <= 0.0 || (dVar16 <= 0.0)))
       ) goto LAB_006224d0;
    if (dVar20 < 0.0) {
      dVar20 = sqrt(dVar20);
    }
    else {
      dVar20 = SQRT(dVar20);
    }
    if (dVar19 < 0.0) {
      dVar19 = sqrt(dVar19);
    }
    else {
      dVar19 = SQRT(dVar19);
    }
    if (dVar18 < 0.0) {
      dVar18 = sqrt(dVar18);
    }
    else {
      dVar18 = SQRT(dVar18);
    }
    if (dVar16 < 0.0) {
      dVar16 = sqrt(dVar16);
    }
    else {
      dVar16 = SQRT(dVar16);
    }
    if ((((!(bool)(0.0 < dVar20 | bVar5)) || (dVar19 <= 0.0)) || (dVar18 <= 0.0)) || (dVar16 <= 0.0)
       ) goto LAB_006224d0;
    uVar9 = (ulong)this->m_R;
    if (this->m_R == 0) {
      local_58 = 0.0;
      dStack_50 = 0.0;
      local_88 = 0.0;
      local_b8._0_8_ = 0.0;
      local_78._0_8_ = 0.0;
      local_118 = 0.0;
      if (bVar4) {
LAB_00622561:
        if (NAN(1.0 - local_88)) {
          ON_SubDIncrementErrorCount();
        }
        dVar17 = ABS(1.0 - local_88);
        if (dVar17 <= local_118) {
          dVar17 = local_118;
        }
        local_118 = dVar17;
        if (0.0 <= dVar17) {
          local_118 = 0.0;
          if (!bVar5) {
            local_118 = ABS(local_58) / dVar20;
            if (local_118 < 0.0) {
              ON_SubDIncrementErrorCount();
            }
            if (local_118 <= dVar17) {
              local_118 = dVar17;
            }
            if (local_118 < 0.0) goto LAB_00622718;
          }
          dVar19 = ABS(dStack_50) / dVar19;
          if ((dVar19 < 0.0) || (local_118 < 0.0)) {
            ON_SubDIncrementErrorCount();
          }
          if (dVar19 <= local_118) {
            dVar19 = local_118;
          }
          local_118 = dVar19;
          if (0.0 <= dVar19) {
            dVar18 = ABS((double)local_b8._0_8_) / dVar18;
            if (dVar18 < 0.0) {
              ON_SubDIncrementErrorCount();
            }
            if (dVar18 <= dVar19) {
              dVar18 = dVar19;
            }
            local_118 = dVar18;
            if (0.0 <= dVar18) {
              local_118 = ABS((double)local_78._0_8_) / dVar16;
              if (local_118 < 0.0) {
                ON_SubDIncrementErrorCount();
              }
              if (local_118 <= dVar18) {
                local_118 = dVar18;
              }
            }
          }
        }
LAB_00622718:
        dVar20 = ON_SubDSectorType::SurfaceNormalSign(&this->m_sector_type);
        if (dVar20 <= 0.0) {
          ON_SubDIncrementErrorCount();
          goto LAB_006224d5;
        }
        goto LAB_0062272a;
      }
    }
    else {
      local_e8 = -local_e8;
      local_58 = 0.0;
      dStack_50 = 0.0;
      uVar12 = 0;
      local_78 = ZEXT816(0);
      local_b8 = ZEXT816(0);
      local_88 = 0.0;
      local_118 = 0.0;
      do {
        if (LP[uVar12] < 0.0) {
          ON_SubDIncrementErrorCount();
          goto LAB_006224d5;
        }
        dVar17 = 0.0;
        dVar14 = 0.0;
        uVar10 = 0;
        do {
          dVar17 = dVar17 + E2[uVar10] * this->m_S[uVar12][uVar10];
          dVar14 = dVar14 + pdVar3[uVar10] * this->m_S[uVar12][uVar10];
          uVar10 = uVar10 + 1;
        } while ((int)uVar9 + (uint)((int)uVar9 == 0) != uVar10);
        auVar1._8_4_ = SUB84(dVar14,0);
        auVar1._0_8_ = dVar17;
        auVar1._12_4_ = (int)((ulong)dVar14 >> 0x20);
        dVar14 = 0.0;
        if (!bVar5) {
          dStack_60 = auVar1._8_8_;
          dVar14 = ABS((pdVar3[uVar12] * local_e8 + dStack_60) / dVar20);
        }
        if ((local_118 < 0.0) || (dVar14 < 0.0)) {
          ON_SubDIncrementErrorCount();
        }
        if (dVar14 <= local_118) {
          dVar14 = local_118;
        }
        local_118 = dVar14;
        if (local_118 < 0.0) break;
        if (uVar8 == 2) {
          dVar17 = (E2[uVar12] * local_e8 + dVar17) / dVar19;
          if (NAN(dVar17)) {
            ON_SubDIncrementErrorCount();
          }
          dVar17 = ABS(dVar17);
          if (dVar17 <= local_118) {
            dVar17 = local_118;
          }
          local_118 = dVar17;
          if (local_118 < 0.0) break;
        }
        if (bVar4) {
          if ((this->m_LP != (double *)0x0) &&
             ((dVar17 = this->m_LP[uVar12], dVar17 != LP[uVar12] || (NAN(dVar17) || NAN(LP[uVar12]))
              ))) {
            ON_SubDIncrementErrorCount();
            goto LAB_006224d5;
          }
          if ((ulong)this->m_R == 0) {
            dVar17 = 0.0;
            dVar14 = 0.0;
          }
          else {
            dVar17 = 0.0;
            dVar14 = 0.0;
            uVar9 = 0;
            do {
              dVar17 = dVar17 + L1[uVar9] * this->m_S[uVar9][uVar12];
              dVar14 = dVar14 + L2[uVar9] * this->m_S[uVar9][uVar12];
              uVar9 = uVar9 + 1;
            } while (this->m_R != uVar9);
          }
          if (bVar6) {
            dVar15 = 0.0;
            if (((int)uVar12 != 2) && (dVar15 = 0.0, (int)uVar12 != 4)) goto LAB_00622342;
          }
          else {
LAB_00622342:
            dVar15 = ABS((L1[uVar12] * local_e8 + dVar17) / dVar18);
          }
          auVar2._8_4_ = SUB84(dVar14,0);
          auVar2._0_8_ = dVar17;
          auVar2._12_4_ = (int)((ulong)dVar14 >> 0x20);
          if ((local_118 < 0.0) || (dVar15 < 0.0)) {
            ON_SubDIncrementErrorCount();
          }
          if (dVar15 <= local_118) {
            dVar15 = local_118;
          }
          local_118 = dVar15;
          if (local_118 < 0.0) break;
          if (uVar8 == 2) {
            dStack_60 = auVar2._8_8_;
            dVar17 = (L2[uVar12] * local_e8 + dStack_60) / dVar16;
            if (NAN(dVar17)) {
              ON_SubDIncrementErrorCount();
            }
            dVar17 = ABS(dVar17);
            if (dVar17 <= local_118) {
              dVar17 = local_118;
            }
            local_118 = dVar17;
            if (local_118 < 0.0) break;
          }
          uVar13 = local_b8._12_4_;
          local_b8._8_4_ = local_b8._8_4_;
          local_b8._0_8_ = (double)local_b8._0_8_ + L1[uVar12];
          local_b8._12_4_ = uVar13;
          uVar13 = local_78._12_4_;
          local_78._8_4_ = local_78._8_4_;
          local_78._0_8_ = (double)local_78._0_8_ + L2[uVar12];
          local_78._12_4_ = uVar13;
          dVar17 = LP[uVar12];
          local_88 = local_88 + dVar17;
          local_58 = local_58 + dVar17 * pdVar3[uVar12];
          dStack_50 = dStack_50 + dVar17 * E2[uVar12];
        }
        uVar12 = uVar12 + 1;
        uVar9 = (ulong)this->m_R;
      } while (uVar12 < uVar9);
      if (bVar4) {
        if (0.0 <= local_118) goto LAB_00622561;
        goto LAB_00622718;
      }
LAB_0062272a:
      if (local_118 < 0.0) {
        ON_SubDIncrementErrorCount();
        goto LAB_006224d5;
      }
    }
  }
  ON_SimpleArray<double>::~ON_SimpleArray(&local_48);
LAB_00621e2c:
  return (double)CONCAT44(local_118._4_4_,(undefined4)local_118);
}

Assistant:

double ON_SubDMatrix::TestMatrix() const
{
  if (nullptr == m_S || m_R < 3)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  if ( false == m_sector_type.IsValid() )
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  if (m_R != m_sector_type.PointRingCount())
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  const double lambda = m_sector_type.SubdominantEigenvalue();
  if (!(lambda > 0.0 && lambda < 1.0))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  const unsigned int lambda_multiplicity = m_sector_type.SubdominantEigenvalueMulitiplicity();
  if ( lambda_multiplicity <= 0 )
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  double rc = 0.0;


  const bool bTestLimitEvaluation = m_sector_type.SurfaceEvaluationCoefficientsAvailable();

  // Eigen information test
  ON_SimpleArray<double> buffer;
  double* E1 = buffer.Reserve(5*m_R);
  double* E2 = E1 + m_R;
  double* LP = E2 + m_R;
  double* L1 = LP + m_R;
  double* L2 = L1 + m_R;
  double d = m_sector_type.GetSubdominantEigenvectors(E1, m_R, E2, m_R);
  if (!(d == lambda))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  if (bTestLimitEvaluation)
  {
    if (!m_sector_type.GetSurfaceEvaluationCoefficients(LP, m_R, L1, m_R, L2, m_R))
      return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  }
  else
  {
    for (unsigned int i = 0; i < m_R; i++)
    {
      LP[i] = 0.0;
      L1[i] = 0.0;
      L2[i] = 0.0;
    }
  }

  // A smooth sector with 2 faces is degenerate and does not have nice eigenvalues and eigenvectors
  // that give a well defined surface normal. In this case we use a heuristic for the normal.
  // When bSmoothTwoFaceCase E1 = {0,0,0,0,0}, lengthE1 = 0, lengthE1 = 0.
  const bool bSmoothTwoFaceCase
    = (m_sector_type.IsSmoothSector() || m_sector_type.IsDartSector())
    && 2u == m_sector_type.FaceCount()
    && 2u == m_sector_type.EdgeCount()
    ;
  const bool bDartTwoFaceCase
    = (m_sector_type.IsSmoothSector() || m_sector_type.IsDartSector())
    && 2u == m_sector_type.FaceCount()
    && 2u == m_sector_type.EdgeCount()
    ;
  const bool bSmoothOrDartTwoFaceCase = bSmoothTwoFaceCase || bDartTwoFaceCase;

  double lengthE1 = 0.0;
  double lengthE2 = 0.0;
  double lengthL1 = 0.0;
  double lengthL2 = 0.0;
  for (unsigned int i = 0; i < m_R; i++)
  {
    lengthE1 += E1[i] * E1[i];
    lengthE2 += E2[i] * E2[i];
    lengthL1 += L1[i] * L1[i];
    lengthL2 += L2[i] * L2[i];
  }
  if (false == bSmoothOrDartTwoFaceCase && !(lengthE1 > 0.0))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  if (!(lengthE2 > 0.0))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  if (!(lengthL1 > 0.0))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  if (!(lengthL2 > 0.0))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  lengthE1 = sqrt(lengthE1);
  lengthE2 = sqrt(lengthE2);
  lengthL1 = sqrt(lengthL1);
  lengthL2 = sqrt(lengthL2);
  if (false == bSmoothOrDartTwoFaceCase && !(lengthE1 > 0.0))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  if (!(lengthE2 > 0.0))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  if (!(lengthL1 > 0.0))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  if (!(lengthL2 > 0.0))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  
  double LPsum = 0.0;
  double L1sum = 0.0;
  double L2sum = 0.0;
  double E1oLP = 0.0;
  double E2oLP = 0.0;
  for (unsigned int i = 0; i < m_R; i++)
  {
    if (!(LP[i] >= 0.0))
      return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

    const double* Si = m_S[i];
    double x1 = 0.0;
    double x2 = 0.0;
    for (unsigned int j = 0; j < m_R; j++)
    {
      // E1, E2 should be eigenvectors of S with eigenvalue lambda
      x1 += Si[j] * E1[j];
      x2 += Si[j] * E2[j];
    }
    d = bSmoothOrDartTwoFaceCase ? 0.0 : fabs((x1 - lambda*E1[i])/lengthE1);
    rc = TestMatrixReturnValue(d,rc);
    if (!(rc >= 0.0))
      break;

    if (2 == lambda_multiplicity)
    {
      d = fabs((x2 - lambda*E2[i])/lengthE2);
      rc = TestMatrixReturnValue(d, rc);
      if (!(rc >= 0.0))
        break;
    }

    if ( false == bTestLimitEvaluation )
      continue;

    if (nullptr != m_LP)
    {
      if ( !(m_LP[i] == LP[i]) )
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
    }

    double y1 = 0.0;
    double y2 = 0.0;
    for (unsigned int j = 0; j < m_R; j++)
    {
      // L1, L2 should be eigenvectors of Transpose(S) with eigenvalue lambda
      y1 += m_S[j][i] * L1[j];
      y2 += m_S[j][i] * L2[j];
    }

    d = (bDartTwoFaceCase && (2u == i || 4u == i)) ? 0.0 : fabs((y1 - lambda*L1[i])/lengthL1);
    rc = TestMatrixReturnValue(d,rc);
    if (!(rc >= 0.0))
      break;

    if (2 == lambda_multiplicity)
    {
      d = fabs((y2 - lambda*L2[i])/lengthL2);
      rc = TestMatrixReturnValue(d, rc);
      if (!(rc >= 0.0))
        break;
    }


    LPsum += LP[i];
    L1sum += L1[i];
    L2sum += L2[i];

    E1oLP += E1[i] * LP[i];
    E2oLP += E2[i] * LP[i];
  }
    
  if (bTestLimitEvaluation)
  {
    while (rc >= 0.0)
    {
      // LP coefficients should sum to 1
      rc = TestMatrixReturnValue(fabs(1.0 - LPsum), rc);
      if (!(rc >= 0.0))
        break;

      // E1 and E2 should be orthogonal to LP which means
      // E0oLP and E1oLP should be zero
      //
      // Why?
      //   Set T = Transpose(S).
      //   T*LP = LP (LP is an eigenvector or T with eigenvalue = 1)
      //   S*E = lambda*E (E is an eigenvector of S with eigenvalue lambda != 1)
      //   LP o E1
      //    = Transpose(LP) * E
      //    = Transpose( T*LP ) * E
      //    = Transpose(LP) * Transpose(T) * E
      //    = Transpose(LP) * S * E
      //    = Transpose(LP) * (lambda E)
      //    = lambda * (Transpose(LP) * E )
      //    = lambda * LPoE
      //   If LPoE != 0, then lambda = 1, which is not the case.
      rc = bSmoothOrDartTwoFaceCase ? 0.0 : TestMatrixReturnValue(fabs(E1oLP) / lengthE1, rc);
      if (!(rc >= 0.0))
        break;
      rc = TestMatrixReturnValue(fabs(E2oLP) / lengthE2, rc);
      if (!(rc >= 0.0))
        break;

      // L1 and L2 should be orthogonal to (1,1,...,1) which means
      // L1 L2 coefficients should sum to zero.
      rc = TestMatrixReturnValue(fabs(L1sum) / lengthL1, rc);
      if (!(rc >= 0.0))
        break;
      rc = TestMatrixReturnValue(fabs(L2sum) / lengthL2, rc);
      if (!(rc >= 0.0))
        break;

      break;
    }

    // See if L1 and L2 can produce a reasonable normal in the simplest possible case
    double z = m_sector_type.SurfaceNormalSign();
    if (!(z > 0.0))
      return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  }

  if (rc >= 0.0)
    return rc;

  return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE); 
}